

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

size_t mbedtls_mpi_lsb(mbedtls_mpi *X)

{
  ulong uVar1;
  int iVar2;
  ulong local_20;
  size_t i;
  mbedtls_mpi *X_local;
  
  local_20 = 0;
  while( true ) {
    if (X->n <= local_20) {
      return 0;
    }
    if (X->p[local_20] != 0) break;
    local_20 = local_20 + 1;
  }
  iVar2 = 0;
  for (uVar1 = X->p[local_20]; (uVar1 & 1) == 0; uVar1 = uVar1 >> 1 | 0x8000000000000000) {
    iVar2 = iVar2 + 1;
  }
  return local_20 * 0x40 + (long)iVar2;
}

Assistant:

size_t mbedtls_mpi_lsb(const mbedtls_mpi *X)
{
    size_t i;
    MBEDTLS_INTERNAL_VALIDATE_RET(X != NULL, 0);

#if defined(__has_builtin)
#if (MBEDTLS_MPI_UINT_MAX == UINT_MAX) && __has_builtin(__builtin_ctz)
    #define mbedtls_mpi_uint_ctz __builtin_ctz
#elif (MBEDTLS_MPI_UINT_MAX == ULONG_MAX) && __has_builtin(__builtin_ctzl)
    #define mbedtls_mpi_uint_ctz __builtin_ctzl
#elif (MBEDTLS_MPI_UINT_MAX == ULLONG_MAX) && __has_builtin(__builtin_ctzll)
    #define mbedtls_mpi_uint_ctz __builtin_ctzll
#endif
#endif

#if defined(mbedtls_mpi_uint_ctz)
    for (i = 0; i < X->n; i++) {
        if (X->p[i] != 0) {
            return i * biL + mbedtls_mpi_uint_ctz(X->p[i]);
        }
    }
#else
    size_t count = 0;
    for (i = 0; i < X->n; i++) {
        for (size_t j = 0; j < biL; j++, count++) {
            if (((X->p[i] >> j) & 1) != 0) {
                return count;
            }
        }
    }
#endif

    return 0;
}